

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall runtime::VirtualMachine::pushStackFrame(VirtualMachine *this,Function *function)

{
  pointer *ppVVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__r;
  iterator __position;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *peVar3;
  ulong uVar4;
  Variable local_68;
  pointer *local_50;
  shared_ptr<runtime::StackFrame> newFrame;
  
  newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  peVar3 = (element_type *)operator_new(0x60);
  (peVar3->locals).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x100000001;
  peVar3->programCounter = (size_t)&PTR___Sp_counted_ptr_inplace_00130820;
  ppVVar1 = &(peVar3->locals).
             super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
             super__Vector_impl_data._M_finish;
  (peVar3->locals).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (peVar3->locals).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar3->function = (Function *)0x0;
  (peVar3->outer).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (peVar3->outer).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (peVar3->opStack).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (peVar3->opStack).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (peVar3->opStack).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar3[1].programCounter = 0;
  peVar3[1].locals.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_50 = ppVVar1;
  newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  if (function->fn->localsCount != 0) {
    uVar4 = 0;
    do {
      local_68.type = Undefined;
      local_68._4_4_ = 0;
      local_68.field_1.integerValue = 0;
      __position._M_current = (Variable *)peVar3->function;
      if ((element_type *)__position._M_current ==
          (peVar3->outer).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         ) {
        std::vector<runtime::Variable,std::allocator<runtime::Variable>>::
        _M_realloc_insert<runtime::Variable_const&>
                  ((vector<runtime::Variable,std::allocator<runtime::Variable>> *)
                   &(peVar3->locals).
                    super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,__position,&local_68);
      }
      else {
        *(undefined8 *)__position._M_current = 0;
        ((__position._M_current)->field_1).integerValue = 0;
        peVar3->function =
             (Function *)
             &(peVar3->function->captures).
              super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < function->fn->localsCount);
  }
  _Var2._M_pi = newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  (peVar3->opStack).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
  _M_impl.super__Vector_impl_data._M_start =
       *(pointer *)
        &newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi[1]._M_use_count;
  __r = newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(peVar3->opStack).
              super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
              super__Vector_impl_data._M_finish,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)__r);
  (peVar3->locals).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (peVar3->outer).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)function;
  *(pointer **)&_Var2._M_pi[1]._M_use_count = ppVVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)__r,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newFrame);
  if (newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               newFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void runtime::VirtualMachine::pushStackFrame(const runtime::Function* function) {
  auto newFrame = std::make_shared<StackFrame>();

  for (std::size_t i = 0; i < function->fn->localsCount; i++) {
    Variable undefined{};
    undefined.type = VariableType::Undefined;
    newFrame->locals.push_back(undefined);
  }

  newFrame->outer = this->stackFrame;
  newFrame->programCounter = 0;
  newFrame->function = function;

  this->stackFrame = newFrame;
}